

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib_Memory.c
# Opt level: O0

void WjTestLib_Free(void *Memory)

{
  void *Memory_local;
  
  if (Memory == (void *)0x0) {
    fprintf(_stderr,"***** MEMORY ERROR (WjTestLib_Free) *****\n");
  }
  else {
    free(Memory);
    gTotalNumFrees = gTotalNumFrees + 1;
    if (gTotalNumAllocations < gTotalNumFrees) {
      fprintf(_stderr,"***** MEMORY ERROR (MORE FREES THAN ALLOCS) *****\n");
    }
  }
  return;
}

Assistant:

void
    WjTestLib_Free
    (
        void*       Memory
    )
{
    if( NULL != Memory )
    {
        free( Memory );
        gTotalNumFrees += 1;
        if( gTotalNumFrees > gTotalNumAllocations )
        {
            fprintf( stderr, "***** MEMORY ERROR (MORE FREES THAN ALLOCS) *****\n" );
        }
    }
    else
    {
        fprintf( stderr, "***** MEMORY ERROR (WjTestLib_Free) *****\n" );
    }
}